

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elimination_ordering.cpp
# Opt level: O2

void indigox::algorithm::QuickBBOrder(PermutableGraph_p *G,ElimOrder *order)

{
  pointer ppvVar1;
  ostream *poVar2;
  __shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  ppvVar1 = (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish != ppvVar1) {
    (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
    _M_finish = ppvVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "To use the QuickBB algorithm, indigoX needs to be built with Java. Will fall back to using the Random algorithm. For shits and giggles."
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&G->super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>
            );
  RandomOrder((PermutableGraph_p *)&_Stack_28,order);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

void QuickBBOrder(PermutableGraph_p G, ElimOrder& order) {
      order.clear();
      
#ifndef BUILD_JAVA
      std::cout << "To use the QuickBB algorithm, indigoX needs to be built with Java. Will fall back to using the Random algorithm. For shits and giggles." << std::endl;
      RandomOrder(G, order);
#else
      String DGFString = G->ToDGFString();
      String EO = utils::GetEliminationOrdering(DGFString);
      
      std::istringstream ss(EO);
      String idx;
      while (std::getline(ss, idx, ' ')) {
        indigox::uid_t i = (indigox::uid_t)std::stoull(idx);
        order.push_back(G->GetVertexByIndex(i).first);
      }
      
#endif
    }